

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateCopyInitFields
          (MessageGenerator *this,Printer *p)

{
  Printer *pPVar1;
  bool bVar2;
  long lVar3;
  allocator<char> local_2a2;
  allocator<char> local_2a1;
  Printer *p_local;
  _Any_data local_298;
  code *local_288;
  code *pcStack_280;
  const_iterator end;
  const_iterator begin;
  char *local_268;
  size_type local_260;
  char local_258 [8];
  undefined8 uStack_250;
  undefined1 *local_248;
  undefined8 local_240;
  undefined1 local_238 [8];
  undefined8 uStack_230;
  char *local_228;
  size_type local_220;
  char local_218 [8];
  undefined8 uStack_210;
  anon_class_16_2_a9d32e29 emit_pending_copy_fields;
  FieldDescriptor *first;
  int has_bit_word_index;
  anon_class_32_4_40eba909 emit_copy_message;
  undefined1 local_1c8 [64];
  __index_type local_188;
  _Alloc_hider local_180;
  size_type local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  bool local_160;
  bool local_118;
  undefined1 *local_110;
  undefined8 local_108;
  undefined1 local_100 [8];
  undefined8 uStack_f8;
  variant<std::__cxx11::string,std::function<bool()>> local_f0 [32];
  char local_d0;
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8;
  undefined1 local_60;
  anon_class_16_2_fd512ddd has_message;
  anon_class_24_3_e47482a1 load_has_bits;
  
  begin._M_current =
       (this->optimized_order_).
       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
       ._M_impl.super__Vector_impl_data._M_start;
  end._M_current =
       (this->optimized_order_).
       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  first = (FieldDescriptor *)0x0;
  load_has_bits.has_bit_word_index = &has_bit_word_index;
  has_bit_word_index = -1;
  emit_copy_message.load_has_bits = &load_has_bits;
  emit_copy_message.has_message = &has_message;
  p_local = p;
  emit_pending_copy_fields.first = &first;
  emit_pending_copy_fields.p = &p_local;
  emit_copy_message.p = &p_local;
  emit_copy_message.this = this;
  has_message.this = this;
  has_message.p = &p_local;
  load_has_bits.this = this;
  load_has_bits.p = &p_local;
  if (0 < this->descriptor_->extension_range_count_) {
    io::Printer::Emit(p,0x4a,
                      "\n      _impl_._extensions_.MergeFrom(this, from._impl_._extensions_);\n    "
                     );
  }
  pPVar1 = p_local;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"copy_fields",&local_2a2);
  local_1c8._0_8_ = local_1c8 + 0x10;
  if (local_228 == local_218) {
    local_1c8._24_8_ = uStack_210;
  }
  else {
    local_1c8._0_8_ = local_228;
  }
  local_1c8._8_8_ = local_220;
  local_220 = 0;
  local_218[0] = '\0';
  local_288 = (code *)0x0;
  pcStack_280 = (code *)0x0;
  local_298._M_unused._M_object = (void *)0x0;
  local_298._8_8_ = 0;
  local_228 = local_218;
  local_298._M_unused._M_object = operator_new(0x40);
  *(const_iterator **)local_298._M_unused._0_8_ = &begin;
  *(const_iterator **)((long)local_298._M_unused._0_8_ + 8) = &end;
  *(MessageGenerator **)((long)local_298._M_unused._0_8_ + 0x10) = this;
  *(Printer ***)((long)local_298._M_unused._0_8_ + 0x18) = &p_local;
  *(anon_class_16_2_a9d32e29 **)((long)local_298._M_unused._0_8_ + 0x20) = &emit_pending_copy_fields
  ;
  *(anon_class_32_4_40eba909 **)((long)local_298._M_unused._0_8_ + 0x28) = &emit_copy_message;
  *(FieldDescriptor ***)((long)local_298._M_unused._0_8_ + 0x30) = &first;
  *(code *)((long)local_298._M_unused._0_8_ + 0x38) = (code)0x0;
  pcStack_280 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
  local_288 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            ((variant<std::__cxx11::string,std::function<bool()>> *)(local_1c8 + 0x20),
             (function<bool_()> *)&local_298);
  std::_Function_base::~_Function_base((_Function_base *)&local_298);
  local_180._M_p = (pointer)&local_170;
  local_178 = 0;
  local_170._M_local_buf[0] = '\0';
  local_160 = false;
  if (local_188 == '\x01') {
    std::__cxx11::string::assign((char *)&local_180);
  }
  local_118 = false;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,"copy_oneof_fields",&local_2a1);
  local_110 = local_100;
  if (local_248 == local_238) {
    uStack_f8 = uStack_230;
  }
  else {
    local_110 = local_248;
  }
  local_108 = local_240;
  local_240 = 0;
  local_238[0] = 0;
  local_288 = (code *)0x0;
  pcStack_280 = (code *)0x0;
  local_298._M_unused._M_object = (void *)0x0;
  local_298._8_8_ = 0;
  local_248 = local_238;
  local_298._M_unused._M_object = operator_new(0x18);
  *(MessageGenerator **)local_298._M_unused._0_8_ = this;
  *(Printer ***)((long)local_298._M_unused._0_8_ + 8) = &p_local;
  *(code *)((long)local_298._M_unused._0_8_ + 0x10) = (code)0x0;
  pcStack_280 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
  local_288 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_f0,(function<bool_()> *)&local_298);
  std::_Function_base::~_Function_base((_Function_base *)&local_298);
  local_c8 = local_b8;
  local_c0 = 0;
  local_b8[0] = 0;
  local_a8 = 0;
  if (local_d0 == '\x01') {
    std::__cxx11::string::assign((char *)&local_c8);
  }
  local_60 = 0;
  io::Printer::Emit(pPVar1,local_1c8,2,0x47,
                    "\n            $copy_fields$;\n            $copy_oneof_fields$;\n          ");
  lVar3 = 0xb8;
  do {
    io::Printer::Sub::~Sub((Sub *)(local_1c8 + lVar3));
    lVar3 = lVar3 + -0xb8;
  } while (lVar3 != -0xb8);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_228);
  bVar2 = ShouldSplit(this->descriptor_,&this->options_);
  pPVar1 = p_local;
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_268,"copy_split_fields",&local_2a2);
    local_1c8._0_8_ = local_1c8 + 0x10;
    if (local_268 == local_258) {
      local_1c8._24_8_ = uStack_250;
    }
    else {
      local_1c8._0_8_ = local_268;
    }
    local_1c8._8_8_ = local_260;
    local_260 = 0;
    local_258[0] = '\0';
    local_288 = (code *)0x0;
    pcStack_280 = (code *)0x0;
    local_298._M_unused._M_object = (void *)0x0;
    local_298._8_8_ = 0;
    local_268 = local_258;
    local_298._M_unused._M_object = operator_new(0x38);
    *(const_iterator **)local_298._M_unused._0_8_ = &begin;
    *(const_iterator **)((long)local_298._M_unused._0_8_ + 8) = &end;
    *(MessageGenerator **)((long)local_298._M_unused._0_8_ + 0x10) = this;
    *(Printer ***)((long)local_298._M_unused._0_8_ + 0x18) = &p_local;
    *(anon_class_16_2_a9d32e29 **)((long)local_298._M_unused._0_8_ + 0x20) =
         &emit_pending_copy_fields;
    *(FieldDescriptor ***)((long)local_298._M_unused._0_8_ + 0x28) = &first;
    *(code *)((long)local_298._M_unused._0_8_ + 0x30) = (code)0x0;
    pcStack_280 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
    local_288 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_manager;
    std::variant<std::__cxx11::string,std::function<bool()>>::
    variant<std::function<bool()>,void,void,std::function<bool()>,void>
              ((variant<std::__cxx11::string,std::function<bool()>> *)(local_1c8 + 0x20),
               (function<bool_()> *)&local_298);
    std::_Function_base::~_Function_base((_Function_base *)&local_298);
    local_180._M_p = (pointer)&local_170;
    local_178 = 0;
    local_170._M_local_buf[0] = '\0';
    local_160 = false;
    if (local_188 == '\x01') {
      std::__cxx11::string::assign((char *)&local_180);
    }
    local_118 = false;
    io::Printer::Emit(pPVar1,local_1c8,1,0xb8,
                      "\n              if (ABSL_PREDICT_FALSE(!from.IsSplitMessageDefault())) {\n                PrepareSplitMessageForWrite();\n                $copy_split_fields$;\n              }\n            "
                     );
    io::Printer::Sub::~Sub((Sub *)local_1c8);
    std::__cxx11::string::~string((string *)&local_268);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateCopyInitFields(io::Printer* p) const {
  auto begin = optimized_order_.begin();
  auto end = optimized_order_.end();
  const FieldDescriptor* first = nullptr;

  auto emit_pending_copy_fields = [&](decltype(end) itend, bool split) {
    if (first != nullptr) {
      const FieldDescriptor* last = itend[-1];
      if (first != last) {
        p->Emit({{"first", FieldName(first)},
                 {"last", FieldName(last)},
                 {"Impl", split ? "Impl_::Split" : "Impl_"},
                 {"pdst", split ? "_impl_._split_" : "&_impl_"},
                 {"psrc", split ? "from._impl_._split_" : "&from._impl_"}},
                R"cc(
                  ::memcpy(reinterpret_cast<char *>($pdst$) +
                               offsetof($Impl$, $first$_),
                           reinterpret_cast<const char *>($psrc$) +
                               offsetof($Impl$, $first$_),
                           offsetof($Impl$, $last$_) -
                               offsetof($Impl$, $first$_) +
                               sizeof($Impl$::$last$_));
                )cc");
      } else {
        p->Emit({{"field", FieldMemberName(first, split)}},
                R"cc(
                  $field$ = from.$field$;
                )cc");
      }
      first = nullptr;
    }
  };

  int has_bit_word_index = -1;
  auto load_has_bits = [&](const FieldDescriptor* field) {
    if (has_bit_indices_.empty()) return;
    int has_bit_index = has_bit_indices_[field->index()];
    if (has_bit_word_index != has_bit_index / 32) {
      p->Emit({{"declare", has_bit_word_index < 0 ? "::uint32_t " : ""},
               {"index", has_bit_index / 32}},
              "$declare$cached_has_bits = _impl_._has_bits_[$index$];\n");
      has_bit_word_index = has_bit_index / 32;
    }
  };

  auto has_message = [&](const FieldDescriptor* field) {
    if (has_bit_indices_.empty()) {
      p->Emit("from.$field$ != nullptr");
    } else {
      int has_bit_index = has_bit_indices_[field->index()];
      p->Emit({{"condition", GenerateConditionMaybeWithProbabilityForField(
                                 has_bit_index, field, options_)}},
              "$condition$");
    }
  };

  auto emit_copy_message = [&](const FieldDescriptor* field) {
    load_has_bits(field);
    p->Emit({{"has_msg", [&] { has_message(field); }},
             {"submsg", FieldMessageTypeName(field, options_)}},
            R"cc(
              $field$ = ($has_msg$)
                            ? $superclass$::CopyConstruct(arena, *from.$field$)
                            : nullptr;
            )cc");
  };

  auto generate_copy_fields = [&] {
    for (auto it = begin; it != end; ++it) {
      const auto& gen = field_generators_.get(*it);
      auto v = p->WithVars(FieldVars(*it, options_));

      // Non trivial field values are copy constructed
      if (!gen.has_trivial_value() || gen.should_split()) {
        emit_pending_copy_fields(it, false);
        continue;
      }

      if (gen.is_message()) {
        emit_pending_copy_fields(it, false);
        emit_copy_message(*it);
      } else if (first == nullptr) {
        first = *it;
      }
    }
    emit_pending_copy_fields(end, false);
  };

  auto generate_copy_split_fields = [&] {
    for (auto it = begin; it != end; ++it) {
      const auto& gen = field_generators_.get(*it);
      auto v = p->WithVars(FieldVars(*it, options_));

      if (!gen.should_split()) {
        emit_pending_copy_fields(it, true);
        continue;
      }

      if (gen.is_trivial()) {
        if (first == nullptr) first = *it;
      } else {
        emit_pending_copy_fields(it, true);
        gen.GenerateCopyConstructorCode(p);
      }
    }
    emit_pending_copy_fields(end, true);
  };

  auto generate_copy_oneof_fields = [&]() {
    for (const auto* oneof : OneOfRange(descriptor_)) {
      p->Emit(
          {{"name", oneof->name()},
           {"NAME", absl::AsciiStrToUpper(oneof->name())},
           {"cases",
            [&] {
              for (const auto* field : FieldRange(oneof)) {
                p->Emit(
                    {{"Name", UnderscoresToCamelCase(field->name(), true)},
                     {"field", FieldMemberName(field, /*split=*/false)},
                     {"body",
                      [&] {
                        field_generators_.get(field).GenerateOneofCopyConstruct(
                            p);
                      }}},
                    R"cc(
                      case k$Name$:
                        $body$;
                        break;
                    )cc");
              }
            }}},
          R"cc(
            switch ($name$_case()) {
              case $NAME$_NOT_SET:
                break;
                $cases$;
            }
          )cc");
    }
  };

  if (descriptor_->extension_range_count() > 0) {
    p->Emit(R"cc(
      _impl_._extensions_.MergeFrom(this, from._impl_._extensions_);
    )cc");
  }

  p->Emit({{"copy_fields", generate_copy_fields},
           {"copy_oneof_fields", generate_copy_oneof_fields}},
          R"cc(
            $copy_fields$;
            $copy_oneof_fields$;
          )cc");

  if (ShouldSplit(descriptor_, options_)) {
    p->Emit({{"copy_split_fields", generate_copy_split_fields}},
            R"cc(
              if (ABSL_PREDICT_FALSE(!from.IsSplitMessageDefault())) {
                PrepareSplitMessageForWrite();
                $copy_split_fields$;
              }
            )cc");
  }
}